

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O0

ssize_t __thiscall bsplib::Unbuf::send(Unbuf *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000084;
  undefined1 local_48 [8];
  Entry entry;
  size_t size_local;
  void *addr_local;
  int dst_pid_local;
  int recv_tag_local;
  Unbuf *this_local;
  
  local_48._0_4_ = SUB84(__buf,0);
  entry.addr = (char *)CONCAT44(in_register_00000084,__flags);
  entry._0_8_ = __n;
  entry.size._0_4_ = __fd;
  entry._24_8_ = entry.addr;
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::push_back
            (&this->m_sends,(value_type *)local_48);
  return extraout_RAX;
}

Assistant:

void Unbuf :: send( int recv_tag, int dst_pid, const void * addr, size_t size )
{
    Entry entry = { dst_pid, 
                    static_cast<char *>(const_cast<void*>(addr)),
                    size, 
                    recv_tag };
    m_sends.push_back( entry );
}